

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O2

void __thiscall
jhu::thrax::AlignedSentencePair::AlignedSentencePair
          (AlignedSentencePair *this,Sentence *s,Sentence *t,Alignment *a)

{
  pointer pbVar1;
  pointer pPVar2;
  bool bVar3;
  out_of_range *this_00;
  
  pbVar1 = (s->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->src).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (s->
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->src).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  (this->src).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (s->
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (s->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (s->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (s->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar1 = (t->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->tgt).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (t->
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->tgt).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  (this->tgt).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (t->
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (t->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (t->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (t->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar2 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->alignment).super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->alignment).super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
  _M_impl.super__Vector_impl_data._M_finish = pPVar2;
  (this->alignment).super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = consistent(this);
  if (bVar3) {
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"inconsistent aligned sentence pair");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

AlignedSentencePair(Sentence s, Sentence t, Alignment a)
      : src(std::move(s)), tgt(std::move(t)), alignment(std::move(a)) {
    if (!consistent()) {
      throw std::out_of_range("inconsistent aligned sentence pair");
    }
  }